

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::AlterInfo::Deserialize(AlterInfo *this,Deserializer *deserializer)

{
  AlterType AVar1;
  OnEntryNotFound OVar2;
  undefined1 uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  _func_int **pp_Var7;
  pointer pAVar8;
  SerializationException *this_00;
  string str;
  type ret_2;
  type ret_1;
  type ret;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> local_b8;
  undefined1 local_b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_b0,deserializer);
    AVar1 = EnumUtil::FromString<duckdb::AlterType>((char *)local_b0._0_8_);
    uVar4 = (uint)AVar1;
    if ((AlterInfo *)local_b0._0_8_ != (AlterInfo *)(local_b0 + 0x10)) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  else {
    uVar4 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"catalog");
  if ((char)iVar5 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_50._M_allocated_capacity = (size_type)&local_40;
    local_40._M_local_buf[0] = '\0';
    local_50._8_8_ = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"schema");
  if ((char)iVar5 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_70._M_allocated_capacity = (size_type)&local_60;
    local_60._M_local_buf[0] = '\0';
    local_70._8_8_ = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_70,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"name");
  if ((char)iVar5 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_90._M_allocated_capacity = (size_type)(local_b0 + 0x30);
    local_80[0] = 0;
    local_90._8_8_ = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_b0 + 0x20,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcc,"if_not_found");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_b0,deserializer);
    OVar2 = EnumUtil::FromString<duckdb::OnEntryNotFound>((char *)local_b0._0_8_);
    if ((AlterInfo *)local_b0._0_8_ != (AlterInfo *)(local_b0 + 0x10)) {
      operator_delete((void *)local_b0._0_8_);
    }
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    OVar2 = (OnEntryNotFound)iVar5;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  uVar6 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcd,"allow_internal");
  pp_Var7 = deserializer->_vptr_Deserializer;
  if ((char)uVar6 == '\0') {
    uVar3 = false;
  }
  else {
    iVar5 = (*pp_Var7[0xc])(deserializer);
    uVar3 = (undefined1)iVar5;
    pp_Var7 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var7[5])(deserializer,(ulong)(uVar6 & 0xff));
  switch(uVar4 & 0xff) {
  case 1:
    AlterTableInfo::Deserialize((AlterTableInfo *)local_b0,deserializer);
    break;
  case 2:
    AlterViewInfo::Deserialize((AlterViewInfo *)local_b0,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_b0._0_8_ = local_b0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"Unsupported type for deserialization of AlterInfo!","");
    SerializationException::SerializationException(this_00,(string *)local_b0);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case 4:
    ChangeOwnershipInfo::Deserialize((ChangeOwnershipInfo *)local_b0,deserializer);
    break;
  case 7:
    SetCommentInfo::Deserialize((SetCommentInfo *)local_b0,deserializer);
    break;
  case 8:
    SetColumnCommentInfo::Deserialize((SetColumnCommentInfo *)local_b0,deserializer);
  }
  local_b8._M_head_impl = (AlterInfo *)local_b0._0_8_;
  pAVar8 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b8);
  ::std::__cxx11::string::operator=((string *)&pAVar8->catalog,(string *)local_50._M_local_buf);
  pAVar8 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b8);
  ::std::__cxx11::string::operator=((string *)&pAVar8->schema,(string *)local_70._M_local_buf);
  pAVar8 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b8);
  ::std::__cxx11::string::operator=((string *)&pAVar8->name,(string *)(local_b0 + 0x20));
  pAVar8 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b8);
  (pAVar8->super_ParseInfo).field_0xa = OVar2;
  pAVar8 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *
                      )&local_b8);
  pAVar8->allow_internal = (bool)uVar3;
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_b8._M_head_impl;
  if ((undefined1 *)local_90._M_allocated_capacity != local_b0 + 0x30) {
    operator_delete((void *)local_90._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_allocated_capacity != &local_60) {
    operator_delete((void *)local_70._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_allocated_capacity != &local_40) {
    operator_delete((void *)local_50._M_allocated_capacity);
  }
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> AlterInfo::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<AlterType>(200, "type");
	auto catalog = deserializer.ReadPropertyWithDefault<string>(201, "catalog");
	auto schema = deserializer.ReadPropertyWithDefault<string>(202, "schema");
	auto name = deserializer.ReadPropertyWithDefault<string>(203, "name");
	auto if_not_found = deserializer.ReadProperty<OnEntryNotFound>(204, "if_not_found");
	auto allow_internal = deserializer.ReadPropertyWithDefault<bool>(205, "allow_internal");
	unique_ptr<AlterInfo> result;
	switch (type) {
	case AlterType::ALTER_TABLE:
		result = AlterTableInfo::Deserialize(deserializer);
		break;
	case AlterType::ALTER_VIEW:
		result = AlterViewInfo::Deserialize(deserializer);
		break;
	case AlterType::CHANGE_OWNERSHIP:
		result = ChangeOwnershipInfo::Deserialize(deserializer);
		break;
	case AlterType::SET_COLUMN_COMMENT:
		result = SetColumnCommentInfo::Deserialize(deserializer);
		break;
	case AlterType::SET_COMMENT:
		result = SetCommentInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of AlterInfo!");
	}
	result->catalog = std::move(catalog);
	result->schema = std::move(schema);
	result->name = std::move(name);
	result->if_not_found = if_not_found;
	result->allow_internal = allow_internal;
	return std::move(result);
}